

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_NestedEnum_Test::
~ParseMessageTest_NestedEnum_Test(ParseMessageTest_NestedEnum_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseMessageTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseMessageTest, NestedEnum) {
  ExpectParsesTo(
      "message TestMessage {\n"
      "  enum NestedEnum {}\n"
      "  optional NestedEnum test_enum = 1;\n"
      "}\n",

      "message_type {"
      "  name: \"TestMessage\""
      "  enum_type {"
      "    name: \"NestedEnum\""
      "  }"
      "  field { name:\"test_enum\" label:LABEL_OPTIONAL number:1"
      "          type_name: \"NestedEnum\" }"
      "}");
}